

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoveGeneration.h
# Opt level: O0

void __thiscall
libchess::Position::generate_capture_promotions(Position *this,MoveList *move_list,Color stm)

{
  value_type vVar1;
  undefined4 in_EDX;
  Position *in_RSI;
  undefined8 in_RDI;
  Square to_sq;
  Bitboard attacks_bb;
  Square from_sq;
  Bitboard opp_occupancy;
  Bitboard pawn_bb;
  Color in_stack_ffffffffffffff08;
  Square in_stack_ffffffffffffff0c;
  Position *in_stack_ffffffffffffff10;
  Bitboard in_stack_ffffffffffffff18;
  Type type;
  Position *in_stack_ffffffffffffff20;
  Position *in_stack_ffffffffffffff28;
  PieceType promotion_pt;
  Bitboard local_68;
  MetaValueType<int> local_60;
  MetaValueType<int> local_5c;
  value_type local_58;
  undefined4 local_50;
  undefined4 local_4c;
  value_type local_48;
  undefined4 local_3c;
  value_type local_38;
  Bitboard local_30;
  undefined4 local_24;
  Bitboard local_20;
  Position *local_18;
  undefined4 local_4;
  
  local_24 = 0;
  local_18 = in_RSI;
  local_4 = in_EDX;
  local_20 = piece_type_bb(in_stack_ffffffffffffff10,
                           (MetaValueType<int>)
                           (value_type)(in_stack_ffffffffffffff18.value_ >> 0x20));
  local_3c = local_4;
  local_38 = (value_type)
             color_bb(in_stack_ffffffffffffff10,
                      (MetaValueType<int>)(value_type)(in_stack_ffffffffffffff18.value_ >> 0x20));
  local_4c = 6;
  local_50 = local_4;
  local_48 = (value_type)
             lookups::relative_rank_mask
                       ((MetaValueType<int>)(value_type)(in_stack_ffffffffffffff18.value_ >> 0x20),
                        (MetaValueType<int>)(value_type)in_stack_ffffffffffffff18.value_);
  local_30 = Bitboard::operator&(in_stack_ffffffffffffff10->piece_type_bb_,in_stack_ffffffffffffff18
                                );
  vVar1 = Bitboard::operator_cast_to_unsigned_long(&local_30);
  Bitboard::operator&=(&local_20,vVar1);
  local_5c.value_ =
       (value_type)
       Color::operator!((Color *)CONCAT44(in_stack_ffffffffffffff0c.super_MetaValueType<int>.value_,
                                          in_stack_ffffffffffffff08.super_MetaValueType<int>.value_)
                       );
  local_58 = (value_type)
             color_bb(in_stack_ffffffffffffff10,
                      (MetaValueType<int>)(value_type)(in_stack_ffffffffffffff18.value_ >> 0x20));
  while (vVar1 = Bitboard::operator_cast_to_unsigned_long(&local_20), vVar1 != 0) {
    local_60.value_ =
         (value_type)
         Bitboard::forward_bitscan
                   ((Bitboard *)
                    CONCAT44(in_stack_ffffffffffffff0c.super_MetaValueType<int>.value_,
                             in_stack_ffffffffffffff08.super_MetaValueType<int>.value_));
    Bitboard::forward_popbit(&local_20);
    lookups::pawn_attacks(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08);
    local_68 = Bitboard::operator&(in_stack_ffffffffffffff10->piece_type_bb_,
                                   in_stack_ffffffffffffff18);
    while( true ) {
      vVar1 = Bitboard::operator_cast_to_unsigned_long(&local_68);
      promotion_pt.super_MetaValueType<int>.value_ =
           SUB84((ulong)in_stack_ffffffffffffff28 >> 0x20,0);
      if (vVar1 == 0) break;
      Bitboard::forward_bitscan
                ((Bitboard *)
                 CONCAT44(in_stack_ffffffffffffff0c.super_MetaValueType<int>.value_,
                          in_stack_ffffffffffffff08.super_MetaValueType<int>.value_));
      type = (Type)(in_stack_ffffffffffffff18.value_ >> 0x38);
      Bitboard::forward_popbit(&local_68);
      in_stack_ffffffffffffff10 = local_18;
      Move::Move((Move *)in_stack_ffffffffffffff20,
                 (MetaValueType<int>)(value_type)((ulong)in_RDI >> 0x20),
                 (MetaValueType<int>)(value_type)in_RDI,promotion_pt,type);
      MoveList::add((MoveList *)
                    CONCAT44(in_stack_ffffffffffffff0c.super_MetaValueType<int>.value_,
                             in_stack_ffffffffffffff08.super_MetaValueType<int>.value_),
                    (Move)(value_type)((ulong)in_stack_ffffffffffffff10 >> 0x20));
      in_stack_ffffffffffffff18.value_ = (value_type)local_18;
      Move::Move((Move *)in_stack_ffffffffffffff20,
                 (MetaValueType<int>)(value_type)((ulong)in_RDI >> 0x20),
                 (MetaValueType<int>)(value_type)in_RDI,promotion_pt,(Type)((ulong)local_18 >> 0x38)
                );
      MoveList::add((MoveList *)
                    CONCAT44(in_stack_ffffffffffffff0c.super_MetaValueType<int>.value_,
                             in_stack_ffffffffffffff08.super_MetaValueType<int>.value_),
                    (Move)(value_type)((ulong)in_stack_ffffffffffffff10 >> 0x20));
      in_stack_ffffffffffffff20 = local_18;
      Move::Move((Move *)local_18,(MetaValueType<int>)(value_type)((ulong)in_RDI >> 0x20),
                 (MetaValueType<int>)(value_type)in_RDI,promotion_pt,
                 (Type)(in_stack_ffffffffffffff18.value_ >> 0x38));
      MoveList::add((MoveList *)
                    CONCAT44(in_stack_ffffffffffffff0c.super_MetaValueType<int>.value_,
                             in_stack_ffffffffffffff08.super_MetaValueType<int>.value_),
                    (Move)(value_type)((ulong)in_stack_ffffffffffffff10 >> 0x20));
      in_stack_ffffffffffffff28 = local_18;
      Move::Move((Move *)in_stack_ffffffffffffff20,
                 (MetaValueType<int>)(value_type)((ulong)in_RDI >> 0x20),
                 (MetaValueType<int>)(value_type)in_RDI,
                 (MetaValueType<int>)(value_type)((ulong)local_18 >> 0x20),
                 (Type)(in_stack_ffffffffffffff18.value_ >> 0x38));
      MoveList::add((MoveList *)
                    CONCAT44(in_stack_ffffffffffffff0c.super_MetaValueType<int>.value_,
                             in_stack_ffffffffffffff08.super_MetaValueType<int>.value_),
                    (Move)(value_type)((ulong)in_stack_ffffffffffffff10 >> 0x20));
    }
  }
  return;
}

Assistant:

inline void Position::generate_capture_promotions(MoveList& move_list, Color stm) const {
    Bitboard pawn_bb = piece_type_bb(constants::PAWN);
    pawn_bb &= color_bb(stm) & lookups::relative_rank_mask(constants::RANK_7, stm);
    Bitboard opp_occupancy = color_bb(!stm);
    while (pawn_bb) {
        Square from_sq = pawn_bb.forward_bitscan();
        pawn_bb.forward_popbit();
        Bitboard attacks_bb = lookups::pawn_attacks(from_sq, stm) & opp_occupancy;
        while (attacks_bb) {
            Square to_sq = attacks_bb.forward_bitscan();
            attacks_bb.forward_popbit();
            move_list.add(Move{from_sq, to_sq, constants::QUEEN, Move::Type::CAPTURE_PROMOTION});
            move_list.add(Move{from_sq, to_sq, constants::KNIGHT, Move::Type::CAPTURE_PROMOTION});
            move_list.add(Move{from_sq, to_sq, constants::ROOK, Move::Type::CAPTURE_PROMOTION});
            move_list.add(Move{from_sq, to_sq, constants::BISHOP, Move::Type::CAPTURE_PROMOTION});
        }
    }
}